

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  significand_type sVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  uint uVar3;
  size_t size;
  ulong uVar4;
  uint uVar5;
  int iVar7;
  long lVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_75 [5];
  sign_t local_70;
  int local_6c;
  uint local_68;
  undefined1 local_64 [4];
  anon_class_56_7_a2a26a24 local_60;
  decimal_fp<float> local_28;
  ulong uVar6;
  
  local_68 = fp->significand;
  uVar10 = 0x1f;
  if ((local_68 | 1) != 0) {
    for (; (local_68 | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  local_6c = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar10 * 2) -
             (uint)(local_68 <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar10 * 2) * 4));
  uVar10 = fspecs._4_4_;
  local_70 = uVar10 >> 8 & 0xff;
  local_75[0] = decimal_point;
  local_28 = (decimal_fp<float>)fspecs;
  if (local_6c < 0) goto LAB_0020657f;
  uVar5 = (local_6c + 1) - (uint)(local_70 == none);
  uVar6 = (ulong)uVar5;
  iVar7 = fp->exponent;
  sVar1 = iVar7 + local_6c;
  uVar3 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_002062ac:
    iVar7 = iVar7 + local_6c + -1;
    cVar9 = decimal_point;
    if ((uVar10 >> 0x14 & 1) == 0) {
      iVar12 = 0;
      if (local_6c == 1) {
        cVar9 = '\0';
      }
    }
    else {
      iVar12 = 0;
      if (0 < (int)(uVar3 - local_6c)) {
        iVar12 = uVar3 - local_6c;
      }
      uVar6 = (ulong)(uVar5 + iVar12);
    }
    local_60.sign = (sign_t *)(CONCAT44(local_68,uVar10 >> 8) & 0xffffffff000000ff);
    local_60.significand._0_5_ = CONCAT14(cVar9,local_6c);
    local_60.significand_size =
         (int *)(CONCAT35(local_60.significand_size._5_3_,
                          CONCAT14(((uVar10 >> 0x10 & 1) == 0) << 5,iVar12)) | 0x4500000000);
    local_60.fp = (decimal_fp<float> *)CONCAT44(local_60.fp._4_4_,iVar7);
    uVar13 = (ulong)specs->width;
    if ((long)uVar13 < 1) {
      bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
              ::anon_class_28_7_94dcc806::operator()
                        ((anon_class_28_7_94dcc806 *)&local_60,out.container);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
    }
    if ((int)sVar1 < 1) {
      iVar7 = 1 - sVar1;
    }
    lVar8 = 2;
    if (99 < iVar7) {
      lVar8 = (ulong)(999 < iVar7) + 3;
    }
    uVar4 = uVar6 + (3 - (ulong)(cVar9 == '\0')) + lVar8;
    uVar6 = 0;
    if (uVar4 <= uVar13) {
      uVar6 = uVar13 - uVar4;
    }
    uVar13 = uVar6 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar13,&specs->fill);
    bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
            ::anon_class_28_7_94dcc806::operator()
                      ((anon_class_28_7_94dcc806 *)&local_60,bVar2.container);
    goto LAB_002064ad;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar11 = 0x10;
    if (0 < (int)uVar3) {
      uVar11 = uVar3;
    }
    if (((int)sVar1 < -3) || ((int)uVar11 < (int)sVar1)) goto LAB_002062ac;
  }
  local_64 = (undefined1  [4])sVar1;
  if (iVar7 < 0) {
    if (0 < (int)sVar1) {
      local_75._1_4_ = uVar3 - local_6c & (int)(uVar10 << 0xb) >> 0x1f;
      local_60.decimal_point = local_75 + 1;
      uVar13 = (ulong)(uint)local_75._1_4_;
      if ((int)local_75._1_4_ < 1) {
        uVar13 = 0;
      }
      size = uVar13 + uVar6 + 1;
      local_60.sign = &local_70;
      local_60.significand = &local_68;
      local_60.significand_size = &local_6c;
      local_60.fp = (decimal_fp<float> *)local_64;
      local_60.fspecs = (float_specs *)local_75;
      bVar2 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_&>
                        (out,specs,size,size,(anon_class_48_6_48d028d1 *)&local_60);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
    }
    uVar10 = -sVar1;
    local_75._1_4_ = uVar10;
    if (SBORROW4(uVar3,uVar10) != (int)(uVar3 + sVar1) < 0) {
      local_75._1_4_ = uVar3;
    }
    if ((int)uVar3 < 0) {
      local_75._1_4_ = uVar10;
    }
    if (local_6c != 0) {
      local_75._1_4_ = uVar10;
    }
    if (-1 < (int)local_75._1_4_) {
      local_60.sign = &local_70;
      local_60.significand = (significand_type *)(local_75 + 1);
      local_60.significand_size = &local_6c;
      local_60.fp = &local_28;
      local_60.fspecs = (float_specs *)local_75;
      local_60.decimal_point = (char *)&local_68;
      uVar13 = (ulong)specs->width;
      if (-1 < (long)uVar13) {
        uVar4 = uVar6 + (uint)local_75._1_4_ + 2;
        uVar6 = 0;
        if (uVar4 <= uVar13) {
          uVar6 = uVar13 - uVar4;
        }
        uVar13 = uVar6 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                    (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                          (out,uVar13,&specs->fill);
        bVar2.container =
             (buffer<char> *)
             write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
             ::anon_class_48_6_9afe1116::operator()
                       ((anon_class_48_6_9afe1116 *)&local_60,bVar2.container);
        goto LAB_002064ad;
      }
    }
    goto LAB_0020657f;
  }
  uVar13 = (ulong)(iVar7 + uVar5);
  local_75._1_4_ = uVar3 - sVar1;
  if ((uVar10 >> 0x14 & 1) != 0) {
    if ((fspecs._4_1_ == '\x02') || (0 < (int)local_75._1_4_)) {
      if ((int)local_75._1_4_ < 1) goto LAB_00206420;
    }
    else {
      local_75._1_4_ = 1;
    }
    uVar13 = uVar13 + (uint)local_75._1_4_;
  }
LAB_00206420:
  local_60.sign = &local_70;
  local_60.significand = &local_68;
  local_60.significand_size = &local_6c;
  local_60.fspecs = (float_specs *)&local_28;
  local_60.decimal_point = local_75;
  local_60.num_zeros = (int *)(local_75 + 1);
  uVar4 = (ulong)specs->width;
  local_60.fp = fp;
  if ((long)uVar4 < 0) {
LAB_0020657f:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar6 = 0;
  if (uVar13 <= uVar4) {
    uVar6 = uVar4 - uVar13;
  }
  uVar13 = uVar6 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                              (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (out,uVar13,&specs->fill);
  bVar2.container =
       (buffer<char> *)
       write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
       ::anon_class_56_7_a2a26a24::operator()(&local_60,bVar2.container);
LAB_002064ad:
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (bVar2,uVar6 - uVar13,&specs->fill);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}